

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O2

uint __thiscall Network::compute_triangles(Network *this,uint node_i)

{
  _Rb_tree_color _Var1;
  pointer psVar2;
  ulong uVar3;
  size_type sVar4;
  _Rb_tree_node_base *p_Var5;
  uint uVar6;
  _Rb_tree_node_base *p_Var7;
  uint node_k;
  _Rb_tree_color local_4c;
  long local_48;
  _Base_ptr local_40;
  _Rb_tree_node_base *local_38;
  
  uVar3 = (ulong)node_i;
  psVar2 = (this->links).
           super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48 = uVar3 * 0x30;
  local_40 = &psVar2[uVar3]._M_t._M_impl.super__Rb_tree_header._M_header;
  uVar6 = 0;
  for (local_38 = *(_Base_ptr *)((long)&psVar2[uVar3]._M_t._M_impl.super__Rb_tree_header + 0x10);
      local_38 != local_40; local_38 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_38)) {
    _Var1 = local_38[1]._M_color;
    psVar2 = (this->links).
             super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var7 = (_Rb_tree_node_base *)((long)&(psVar2->_M_t)._M_impl.super__Rb_tree_header + local_48);
    for (p_Var5 = *(_Rb_tree_node_base **)
                   ((long)&(psVar2->_M_t)._M_impl.super__Rb_tree_header + local_48 + 0x10U);
        p_Var5 != p_Var7; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      local_4c = p_Var5[1]._M_color;
      if (local_4c != _Var1) {
        sVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                count((this->links).
                      super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + _Var1,&local_4c);
        uVar6 = (uVar6 + 1) - (uint)(sVar4 == 0);
      }
    }
  }
  return uVar6 >> 1;
}

Assistant:

unsigned int compute_triangles(unsigned int node_i) const {
        unsigned int triangles = 0;
        for (unsigned int node_j : links[node_i])
            for (unsigned int node_k : links[node_i])
                if (node_k != node_j and links[node_j].count(node_k))
                    triangles++;
        return triangles/2;
    }